

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O3

void __thiscall CTcMain::check_error_limit(CTcMain *this)

{
  uint uVar1;
  undefined8 in_R9;
  
  uVar1 = this->error_count_;
  if ((int)uVar1 <= this->max_error_count_) {
    return;
  }
  this->max_error_count_ = uVar1 + 100;
  log_error(this,G_tok->last_desc_,G_tok->last_linenum_,TC_SEV_FATAL,0x296e,in_R9,(ulong)uVar1);
  err_throw(0x2906);
}

Assistant:

void CTcMain::check_error_limit()
{
    /* check the error count against the limit */
    if (error_count_ > max_error_count_)
    {
        /* 
         *   raise the maximum error count a bit so that we don't encounter
         *   another maximum error situation and loop on flagging the
         *   too-many-errors error while trying to display a too-many-errors
         *   error 
         */
        max_error_count_ = error_count_ + 100;

        /* display a message explaining the problem */
        log_error(G_tok->get_last_desc(), G_tok->get_last_linenum(),
                  TC_SEV_FATAL, TCERR_TOO_MANY_ERRORS);

        /* throw the generic fatal error, since we've logged this */
        err_throw(TCERR_FATAL_ERROR);
    }
}